

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ilist_node.h
# Opt level: O3

void __thiscall spvtools::opt::Instruction::Instruction(Instruction *this,IRContext *c,Op op)

{
  uint32_t uVar1;
  
  (this->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_ = (Instruction *)0x0;
  (this->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_ = (Instruction *)0x0;
  (this->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ = false;
  (this->super_IntrusiveNodeBase<spvtools::opt::Instruction>)._vptr_IntrusiveNodeBase =
       (_func_int **)&PTR__Instruction_00b02eb0;
  this->context_ = c;
  this->opcode_ = op;
  this->has_type_id_ = false;
  this->has_result_id_ = false;
  if (c->unique_id_ != 0xffffffff) {
    uVar1 = c->unique_id_ + 1;
    c->unique_id_ = uVar1;
    this->unique_id_ = uVar1;
    (this->operands_).
    super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (this->operands_).
    super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (this->operands_).
    super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (this->dbg_line_insts_).
    super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (this->dbg_line_insts_).
    super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (this->dbg_line_insts_).
    super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (this->dbg_scope_).lexical_scope_ = 0;
    (this->dbg_scope_).inlined_at_ = 0;
    return;
  }
  __assert_fail("unique_id_ != std::numeric_limits<uint32_t>::max()",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/ir_context.h"
                ,0x1fe,"uint32_t spvtools::opt::IRContext::TakeNextUniqueId()");
}

Assistant:

inline IntrusiveNodeBase<NodeType>::IntrusiveNodeBase()
    : next_node_(nullptr), previous_node_(nullptr), is_sentinel_(false) {}